

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O3

void __thiscall
chrono::ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed>::LoadIntLoadResidual_Mv
          (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this,ChVectorDynamic<> *R,
          ChVectorDynamic<> *w,double c)

{
  undefined1 auVar1 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  double *pdVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  element_type *peVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ChVectorDynamic<> grouped_w;
  ChVectorDynamic<> grouped_cMv;
  assign_op<double,_double> local_a9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  double local_80;
  ulong local_78;
  ChVectorDynamic<> *local_70;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_68;
  
  if (*(long *)&this->field_0x38 != 0) {
    local_80 = c;
    iVar6 = (**(code **)(*(long *)this + 0x38))();
    local_a8.m_storage.m_data = (double *)0x0;
    local_a8.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_a8,(long)iVar6);
    iVar6 = (**(code **)(*(long *)this + 0x38))(this);
    local_98.m_storage.m_data = (double *)0x0;
    local_98.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,(long)iVar6);
    uVar10 = 0;
    iVar6 = 0;
    local_70 = R;
    while( true ) {
      peVar12 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar12 == (element_type *)0x0) {
        peVar12 = (element_type *)0x0;
      }
      else {
        peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
      }
      p_Var2 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
               super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      iVar7 = (**(code **)(*(long *)peVar12 + 0x40))();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (iVar7 <= iVar6) break;
      peVar12 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar12 == (element_type *)0x0) {
        peVar12 = (element_type *)0x0;
      }
      else {
        peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
      }
      p_Var2 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
               super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      cVar5 = (**(code **)(*(long *)peVar12 + 0x58))(peVar12,iVar6);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (cVar5 != '\0') {
        peVar12 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                  super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar12 == (element_type *)0x0) {
          peVar12 = (element_type *)0x0;
        }
        else {
          peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
        }
        p_Var2 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                 super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        iVar7 = (**(code **)(*(long *)peVar12 + 0x48))(peVar12,iVar6);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        uVar13 = 0;
        local_78 = uVar10;
        while( true ) {
          peVar12 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                    super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar12 == (element_type *)0x0) {
            peVar12 = (element_type *)0x0;
          }
          else {
            peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
          }
          p_Var2 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                   super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          uVar8 = (**(code **)(*(long *)peVar12 + 0x50))(peVar12,iVar6);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if (uVar8 <= uVar13) break;
          uVar9 = (ulong)(uint)(iVar7 + (int)uVar13);
          if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)uVar9) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          uVar11 = uVar10 + uVar13 & 0xffffffff;
          if (local_a8.m_storage.m_rows <= (long)uVar11) {
LAB_00125b59:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          uVar13 = uVar13 + 1;
          local_a8.m_storage.m_data[uVar11] =
               (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar9];
        }
        uVar10 = (ulong)(uint)((int)local_78 + (int)uVar13);
      }
      iVar6 = iVar6 + 1;
    }
    lVar3 = *(long *)&this->field_0x38;
    local_68.m_lhs.m_lhs.m_cols.m_value = *(ulong *)(lVar3 + 0x78);
    local_68.m_lhs.m_lhs.m_rows.m_value = *(ulong *)(lVar3 + 0x70);
    if ((local_68.m_lhs.m_lhs.m_cols.m_value | local_68.m_lhs.m_lhs.m_rows.m_value) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    local_68.m_lhs.m_rhs = (RhsNested)(lVar3 + 0x68);
    local_68.m_rhs = (RhsNested)&local_a8;
    local_68.m_lhs.m_lhs.m_functor.m_other = local_80;
    if (local_68.m_lhs.m_lhs.m_cols.m_value != local_a8.m_storage.m_rows) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    uVar10 = 0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_98,&local_68,&local_a9,(type)0x0);
    iVar6 = 0;
    while( true ) {
      peVar12 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar12 == (element_type *)0x0) {
        peVar12 = (element_type *)0x0;
      }
      else {
        peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
      }
      p_Var2 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
               super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      iVar7 = (**(code **)(*(long *)peVar12 + 0x40))();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (iVar7 <= iVar6) break;
      peVar12 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar12 == (element_type *)0x0) {
        peVar12 = (element_type *)0x0;
      }
      else {
        peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
      }
      p_Var2 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
               super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      cVar5 = (**(code **)(*(long *)peVar12 + 0x58))(peVar12,iVar6);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (cVar5 != '\0') {
        peVar12 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                  super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar12 == (element_type *)0x0) {
          peVar12 = (element_type *)0x0;
        }
        else {
          peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
        }
        p_Var2 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                 super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        iVar7 = (**(code **)(*(long *)peVar12 + 0x48))(peVar12,iVar6);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        uVar13 = 0;
        while( true ) {
          peVar12 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                    super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar12 == (element_type *)0x0) {
            peVar12 = (element_type *)0x0;
          }
          else {
            peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
          }
          p_Var2 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
                   super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          uVar8 = (**(code **)(*(long *)peVar12 + 0x50))(peVar12,iVar6);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if (uVar8 <= uVar13) break;
          uVar9 = uVar10 + uVar13 & 0xffffffff;
          if ((local_98.m_storage.m_rows <= (long)uVar9) ||
             (uVar11 = (ulong)(uint)(iVar7 + (int)uVar13),
             (local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows <= (long)uVar11)) goto LAB_00125b59;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_80;
          uVar13 = uVar13 + 1;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_98.m_storage.m_data[uVar9];
          pdVar4 = (local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar4[uVar11];
          auVar1 = vfmadd213sd_fma(auVar14,auVar15,auVar1);
          pdVar4[uVar11] = auVar1._0_8_;
        }
        uVar10 = (ulong)(uint)((int)uVar10 + (int)uVar13);
      }
      iVar6 = iVar6 + 1;
    }
    if (local_98.m_storage.m_data != (double *)0x0) {
      free((void *)local_98.m_storage.m_data[-1]);
    }
    if (local_a8.m_storage.m_data != (double *)0x0) {
      free((void *)local_a8.m_storage.m_data[-1]);
    }
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadIntLoadResidual_Mv(ChVectorDynamic<>& R, const ChVectorDynamic<>& w, double c) {
    if (!this->jacobians)
        return;
    // fetch w as a contiguous vector
    ChVectorDynamic<> grouped_w(this->LoadGet_ndof_w());
    ChVectorDynamic<> grouped_cMv(this->LoadGet_ndof_w());
    unsigned int rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                grouped_w(rowQ) = w(row + moffset);
                ++rowQ;
            }
        }
    }
    // do computation R=c*M*v
    grouped_cMv = c * this->jacobians->M * grouped_w;
    rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                R(row + moffset) += grouped_cMv(rowQ) * c;
                ++rowQ;
            }
        }
    }
}